

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::NewFloatConstantValue(GlobOpt *this,FloatConstType floatValue,Opnd *opnd)

{
  ValueInfo *this_00;
  Value *val;
  
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
  ValueInfo::ValueInfo(this_00,(ValueType)0x108,FloatConstant);
  this_00->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5368;
  this_00[1]._vptr_ValueInfo = (_func_int **)floatValue;
  val = NewValue(this,this_00);
  GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,val,opnd);
  return val;
}

Assistant:

Value *
GlobOpt::NewFloatConstantValue(const FloatConstType floatValue, IR::Opnd *const opnd)
{
    FloatConstantValueInfo *valueInfo = FloatConstantValueInfo::New(this->alloc, floatValue);
    Value *val = NewValue(valueInfo);

    CurrentBlockData()->InsertNewValue(val, opnd);
    return val;
}